

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::ModuleCloner::getRemappedProcessorInstance
          (ModuleCloner *this,pool_ptr<soul::heart::ProcessorInstance> *old)

{
  bool bVar1;
  ProcessorInstance *o;
  mapped_type *pmVar2;
  pool_ptr<soul::heart::ProcessorInstance> *in_RDX;
  pool_ref<const_soul::heart::ProcessorInstance> local_28 [2];
  pool_ptr<soul::heart::ProcessorInstance> *old_local;
  ModuleCloner *this_local;
  
  old_local = old;
  this_local = this;
  bVar1 = pool_ptr<soul::heart::ProcessorInstance>::operator==(in_RDX,(void *)0x0);
  if (bVar1) {
    pool_ptr<soul::heart::ProcessorInstance>::pool_ptr
              ((pool_ptr<soul::heart::ProcessorInstance> *)this);
  }
  else {
    o = pool_ptr<soul::heart::ProcessorInstance>::operator*(in_RDX);
    pool_ref<soul::heart::ProcessorInstance_const>::pool_ref<soul::heart::ProcessorInstance,void>
              ((pool_ref<soul::heart::ProcessorInstance_const> *)local_28,o);
    pmVar2 = std::
             unordered_map<soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>_>
             ::operator[]((unordered_map<soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>,_std::hash<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::equal_to<soul::pool_ref<const_soul::heart::ProcessorInstance>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::ProcessorInstance>,_soul::pool_ptr<soul::heart::ProcessorInstance>_>_>_>
                           *)(old + 0x1a),(key_type *)local_28);
    this->oldModule = (Module *)pmVar2->object;
    pool_ref<const_soul::heart::ProcessorInstance>::~pool_ref(local_28);
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> getRemappedProcessorInstance (pool_ptr<heart::ProcessorInstance> old)
    {
        if (old == nullptr)
            return {};

        return processorInstanceMappings[*old];
    }